

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryUint::test
          (ShaderBitfieldOperationCaseUnaryUint *this,Data *data)

{
  UnaryUFunc p_Var1;
  GLuint GVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = this->m_components < 1;
  if (0 < this->m_components) {
    lVar5 = 0;
    do {
      GVar2 = (*this->m_func)(data->inUvec4[lVar5]);
      uVar3 = data->outUvec4[lVar5];
      p_Var1 = this->m_func;
      if ((((p_Var1 == findMSBI) || (p_Var1 == findMSBU)) || (p_Var1 == bitCount)) ||
         (p_Var1 == findLSB)) {
        uVar3 = (int)(uVar3 << 0x17) >> 0x1f & 0xfffffe00U | uVar3 & 0x1ff;
      }
      if (uVar3 != GVar2) {
        return bVar4;
      }
      lVar5 = lVar5 + 1;
      bVar4 = this->m_components <= lVar5;
    } while (lVar5 < this->m_components);
  }
  return bVar4;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected = m_func(data->inUvec4[i]);
			GLuint output   = data->outUvec4[i];
			if (m_func == (UnaryUFunc)glcts::bitCount || m_func == (UnaryUFunc)glcts::findLSB ||
				m_func == (UnaryUFunc)glcts::findMSBU || m_func == (UnaryUFunc)glcts::findMSBI)
			{
				/* The built-in bitCount, findLSB and findMSB functions
				 * return a lowp int, which can be encoded with as little
				 * as 9 bits. Since findLSB and findMSB can return negative
				 * values (namely, -1), we cannot compare the value directly
				 * against a (32-bit) GLuint.
				 */
				GLuint output_9bits = output & 0x1ff;
				GLuint sign_extend  = output_9bits & 0x100 ? 0xfffffe00 : 0;
				output				= output_9bits | sign_extend;
			}

			if (output != expected)
			{
				return false;
			}
		}
		return true;
	}